

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,char *signame,size_t signame_len)

{
  LIBSSH2_SESSION *pLVar1;
  bool bVar2;
  int iVar3;
  time_t start_time;
  int unaff_EBP;
  uchar *local_48;
  size_t local_40;
  char *local_38;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  local_38 = signame;
  start_time = time((time_t *)0x0);
  local_40 = signame_len;
  do {
    pLVar1 = channel->session;
    if (channel->sendsignal_state == libssh2_NB_state_idle) {
      channel->sendsignal_packet_len = signame_len + 0x14;
      local_48 = (uchar *)(*pLVar1->alloc)(signame_len + 0x14,&pLVar1->abstract);
      channel->sendsignal_packet = local_48;
      if (local_48 != (uchar *)0x0) {
        *local_48 = 'b';
        local_48 = local_48 + 1;
        _libssh2_store_u32(&local_48,(channel->remote).id);
        _libssh2_store_str(&local_48,"signal",6);
        *local_48 = '\0';
        local_48 = local_48 + 1;
        _libssh2_store_str(&local_48,local_38,local_40);
        channel->sendsignal_state = libssh2_NB_state_created;
        unaff_EBP = (int)&local_48;
        goto LAB_0010cf2c;
      }
      unaff_EBP = _libssh2_error(pLVar1,-6,"Unable to allocate memory for signal request");
    }
    else {
LAB_0010cf2c:
      iVar3 = -0xe;
      if (channel->sendsignal_state == libssh2_NB_state_created) {
        iVar3 = _libssh2_transport_send
                          (pLVar1,channel->sendsignal_packet,channel->sendsignal_packet_len,
                           (uchar *)0x0,0);
        if (iVar3 == 0) {
          (*pLVar1->free)(channel->sendsignal_packet,&pLVar1->abstract);
          bVar2 = true;
          iVar3 = 0;
        }
        else {
          if (iVar3 == -0x25) {
            unaff_EBP = -0x25;
            _libssh2_error(pLVar1,-0x25,"Would block sending signal request");
          }
          else {
            (*pLVar1->free)(channel->sendsignal_packet,&pLVar1->abstract);
            channel->sendsignal_state = libssh2_NB_state_idle;
            unaff_EBP = _libssh2_error(pLVar1,iVar3,"Unable to send signal packet");
          }
          iVar3 = -0xe;
          bVar2 = false;
        }
        if (!bVar2) goto LAB_0010cfd8;
      }
      channel->sendsignal_state = libssh2_NB_state_idle;
      unaff_EBP = iVar3;
    }
LAB_0010cfd8:
    if (unaff_EBP != -0x25) {
      return unaff_EBP;
    }
    pLVar1 = channel->session;
    unaff_EBP = -0x25;
    if (pLVar1 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar1->api_block_mode == 0) {
      return -0x25;
    }
    iVar3 = _libssh2_wait_socket(pLVar1,start_time);
    if (iVar3 != 0) {
      return iVar3;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_channel_signal_ex(LIBSSH2_CHANNEL *channel,
                          const char *signame,
                          size_t signame_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_signal(channel, signame, signame_len));
    return rc;
}